

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  ulong uVar5;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar6;
  char *pcVar7;
  reference pcVar8;
  size_t sVar9;
  char *p_00;
  basic_format_specs<char> *specs;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *in_RDI;
  char *data;
  int i;
  char *p;
  int digit_index;
  basic_string_view<char> s;
  type usize;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char digits [40];
  const_iterator group;
  int n;
  int size;
  int num_digits;
  char sep;
  string groups;
  allocator<char> *in_stack_fffffffffffffc68;
  locale_ref in_stack_fffffffffffffc70;
  locale_ref in_stack_fffffffffffffc78;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *in_stack_fffffffffffffcc0
  ;
  anon_class_16_2_3f014a30 *in_stack_fffffffffffffce8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  int iVar10;
  int local_2ec;
  undefined1 local_2e8 [24];
  buffer<char> local_2d0 [16];
  format_decimal_result<char_*> local_b8;
  char local_a8 [48];
  undefined8 local_78;
  undefined8 local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  int local_5c;
  int local_58;
  int local_54;
  buffer<char> *local_50;
  char local_41 [17];
  buffer<char> *local_30;
  string local_28 [40];
  
  local_30 = in_RDI[1].container;
  grouping<char>(in_stack_fffffffffffffc78);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    local_50 = in_RDI[1].container;
    local_41[0] = thousands_sep<char>(in_stack_fffffffffffffc70);
    if (local_41[0] == '\0') {
      on_dec(in_stack_fffffffffffffcc0);
      local_41[1] = '\x01';
      local_41[2] = '\0';
      local_41[3] = '\0';
      local_41[4] = '\0';
    }
    else {
      local_5c = count_digits((uint64_t)in_RDI[3].container);
      local_58 = local_5c;
      local_54 = local_5c;
      local_68._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        local_70 = std::__cxx11::string::cend();
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffc70.locale_,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffc68);
        iVar10 = local_5c;
        bVar3 = false;
        if (bVar2) {
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_68);
          bVar3 = false;
          if (*pcVar8 < iVar10) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_68);
            bVar3 = false;
            if ('\0' < *pcVar8) {
              pcVar8 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_68);
              cVar1 = *pcVar8;
              cVar4 = max_value<char>();
              bVar3 = cVar1 != cVar4;
            }
          }
        }
        if (!bVar3) break;
        local_58 = local_58 + 1;
        pcVar8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_68);
        local_5c = local_5c - *pcVar8;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_68);
      }
      local_78 = std::__cxx11::string::cend();
      bVar3 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc70.locale_,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc68);
      if (bVar3) {
        iVar10 = local_5c + -1;
        pcVar7 = (char *)std::__cxx11::string::back();
        local_58 = iVar10 / (int)*pcVar7 + local_58;
      }
      local_b8 = format_decimal<char,unsigned_long>
                           (local_a8,(unsigned_long)in_RDI[3].container,local_54);
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc70.locale_,in_stack_fffffffffffffc68);
      std::allocator<char>::~allocator((allocator<char> *)(local_2e8 + 0x17));
      local_58 = local_58 + *(int *)((long)(in_RDI + 4) + 4);
      local_2e8._16_4_ = to_unsigned<int>(local_58);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc70.locale_,(size_t)in_stack_fffffffffffffc68);
      basic_string_view<char>::basic_string_view((basic_string_view<char> *)local_2e8,local_41,1);
      local_2ec = 0;
      bVar6.container = (buffer<char> *)std::__cxx11::string::cbegin();
      local_68._M_current = (char *)bVar6.container;
      pcVar7 = buffer<char>::data(local_2d0);
      pcVar7 = pcVar7 + (long)local_58 + -1;
      iVar10 = local_54;
      while (iVar10 = iVar10 + -1, 0 < iVar10) {
        p_00 = pcVar7 + -1;
        *pcVar7 = local_a8[iVar10];
        pcVar8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_68);
        pcVar7 = p_00;
        if ('\0' < *pcVar8) {
          local_2ec = local_2ec + 1;
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_68);
          pcVar7 = p_00;
          if (local_2ec % (int)*pcVar8 == 0) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_68);
            cVar1 = *pcVar8;
            cVar4 = max_value<char>();
            pcVar7 = p_00;
            if (cVar1 != cVar4) {
              in_stack_fffffffffffffcf0 =
                   __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffc78.locale_,
                               (difference_type)in_stack_fffffffffffffc70.locale_);
              in_stack_fffffffffffffce8 = (anon_class_16_2_3f014a30 *)std::__cxx11::string::cend();
              bVar3 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffc70.locale_,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffc68);
              if (bVar3) {
                local_2ec = 0;
                __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_68);
              }
              in_stack_fffffffffffffc70.locale_ = local_2e8;
              basic_string_view<char>::data
                        ((basic_string_view<char> *)in_stack_fffffffffffffc70.locale_);
              in_stack_fffffffffffffc78.locale_ =
                   basic_string_view<char>::data(in_stack_fffffffffffffc70.locale_);
              basic_string_view<char>::size
                        ((basic_string_view<char> *)in_stack_fffffffffffffc70.locale_);
              pcVar7 = p_00;
              sVar9 = basic_string_view<char>::size
                                ((basic_string_view<char> *)in_stack_fffffffffffffc70.locale_);
              make_checked<char>(p_00,sVar9);
              std::uninitialized_copy<char_const*,char*>
                        (p_00,(char *)in_stack_fffffffffffffc78.locale_,
                         (char *)in_stack_fffffffffffffc70.locale_);
              sVar9 = basic_string_view<char>::size((basic_string_view<char> *)local_2e8);
              pcVar7 = pcVar7 + -sVar9;
            }
          }
        }
      }
      specs = (basic_format_specs<char> *)(pcVar7 + -1);
      *pcVar7 = local_a8[0];
      if (*(int *)((long)(in_RDI + 4) + 4) != 0) {
        *(char *)&specs->width = '-';
      }
      buffer<char>::data(local_2d0);
      bVar6.container =
           (buffer<char> *)
           write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_long>::on_num()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                     (bVar6.container,specs,CONCAT44(iVar10,in_stack_fffffffffffffcf8),
                      (size_t)in_stack_fffffffffffffcf0._M_current,in_stack_fffffffffffffce8);
      in_RDI->container = bVar6.container;
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc70.locale_);
      local_41[1] = '\0';
      local_41[2] = '\0';
      local_41[3] = '\0';
      local_41[4] = '\0';
    }
  }
  else {
    on_dec(in_stack_fffffffffffffcc0);
    local_41[1] = '\x01';
    local_41[2] = '\0';
    local_41[3] = '\0';
    local_41[4] = '\0';
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }